

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# econftool.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  __uid_t _Var2;
  __uid_t __uid;
  econf_err error;
  __pid_t _Var3;
  uint uVar4;
  uint extraout_EAX;
  int iVar5;
  int extraout_EAX_00;
  undefined8 uVar6;
  econf_file *peVar7;
  passwd *ppVar8;
  econf_file *peVar9;
  int *piVar10;
  char *pcVar11;
  size_t sVar12;
  undefined1 show;
  undefined8 extraout_RDX;
  char *pcVar13;
  char *pcVar14;
  char **__s;
  char *pcVar15;
  size_t sVar16;
  econf_file **ppeVar17;
  econf_file **ppeVar18;
  econf_file *key_file_edit;
  char *home_dir;
  uint local_94;
  uint local_90;
  short local_8c;
  undefined1 local_8a;
  econf_file **local_88;
  econf_file **local_80;
  econf_file **local_78;
  char **groupsEdit;
  econf_file **key_files;
  undefined6 uStack_60;
  undefined2 uStack_5a;
  undefined6 uStack_58;
  size_t groupEditCount;
  int index;
  size_t groupCount;
  
  home_dir = (char *)0x0;
  index = 0;
  local_78 = (econf_file **)argv;
  root_dir = strdup("/etc");
  usr_root_dir = strdup("/usr/etc");
  conf_dir = strdup("");
  conf_basename = strdup("");
  local_90 = (uint)CONCAT71((int7)((ulong)conf_basename >> 8),1);
  local_80 = (econf_file **)0x105030;
  local_88 = (econf_file **)0x10502e;
  local_94 = 0;
  pcVar13 = "hfyuc:d:";
  __s = &conf_dir;
  ppeVar17 = local_78;
LAB_00103094:
  while( true ) {
    uVar6 = getopt_long(argc,ppeVar17,"hfyuc:d:",main::longopts,&index);
    ppeVar18 = local_78;
    peVar7 = (econf_file *)local_80;
    iVar5 = (int)uVar6;
    if (iVar5 != 0x79) break;
    non_interactive = '\x01';
  }
  ppeVar17 = local_78;
  switch(iVar5) {
  case 99:
    local_88 = _optarg;
    goto LAB_00103094;
  case 100:
    local_80 = _optarg;
    goto LAB_00103094;
  case 0x65:
  case 0x67:
    goto switchD_001030ce_caseD_65;
  case 0x66:
    free(conf_dir);
    iVar5 = asprintf(&conf_dir,"%s","/etc");
    if (iVar5 < 0) goto LAB_00103b3f;
    change_root_dir(&conf_dir);
    local_90 = 0;
    ppeVar17 = local_78;
    goto LAB_00103094;
  case 0x68:
    usage();
    __s = (char **)0x0;
    goto LAB_00103964;
  default:
    if (iVar5 == -1) {
      if (argc < 2) {
        usage();
LAB_0010395e:
        __s = (char **)0x1;
        goto LAB_00103964;
      }
      if ((argc == 2) || (argc - _optind < 2)) {
        main_cold_30();
        goto LAB_0010395e;
      }
      iVar5 = strcmp((char *)local_80,"spaces");
      if (iVar5 == 0) {
        pcVar11 = " \t\f\n\r\v";
      }
      else {
        pcVar13 = replace_str((char *)peVar7,"\\t","\t");
        pcVar13 = replace_str(pcVar13,"\\f","\f");
        pcVar13 = replace_str(pcVar13,"\\n","\n");
        pcVar13 = replace_str(pcVar13,"\\r","\r");
        pcVar11 = replace_str(pcVar13,"\\v","\v");
      }
      _Var2 = getuid();
      pcVar13 = (char *)peVar7;
      if (*ppeVar18[(long)_optind + 1] != (econf_file)0x2f) {
        local_80 = (econf_file **)CONCAT44(local_80._4_4_,_Var2);
        pcVar13 = strrchr((char *)ppeVar18[(long)_optind + 1],0x2e);
        conf_suffix = pcVar13;
        if ((econf_file **)pcVar13 == (econf_file **)0x0) goto LAB_00103b49;
        free(conf_basename);
        ppeVar18 = local_78;
        __s = (char **)local_78[(long)_optind + 1];
        sVar12 = strlen((char *)__s);
        sVar16 = strlen(pcVar13);
        conf_basename = strndup((char *)__s,sVar12 - sVar16);
        _Var2 = (__uid_t)local_80;
        if (conf_basename == (char *)0x0) {
          main_cold_2();
          goto LAB_0010395e;
        }
      }
      peVar7 = (econf_file *)strdup((char *)ppeVar18[(long)_optind + 1]);
      conf_filename = (char *)peVar7;
      if (peVar7 == (econf_file *)0x0) goto LAB_00103b44;
      if ((local_90 & 1) != 0) {
        __s = &conf_dir;
        free(conf_dir);
        iVar5 = asprintf(&conf_dir,"/etc/%s.d",peVar7);
        if (iVar5 < 0) goto LAB_00103b4e;
        change_root_dir(&conf_dir);
      }
      free(conf_path);
      pcVar13 = conf_filename;
      iVar5 = asprintf(&conf_path,"%s/%s",conf_dir);
      show = SUB81(pcVar13,0);
      if (iVar5 < 0) {
        main_cold_27();
        goto LAB_0010395e;
      }
      pcVar13 = getenv("ECONFTOOL_ROOT");
      if (pcVar13 == (char *)0x0) {
        pcVar13 = getenv("HOME");
        if (pcVar13 == (char *)0x0) {
          local_80 = (econf_file **)pcVar11;
          __uid = getuid();
          ppVar8 = getpwuid(__uid);
          __s = (char **)0x0;
          bVar1 = true;
          if (ppVar8 != (passwd *)0x0) {
            free(home_dir);
            home_dir = strdup(ppVar8->pw_dir);
            if (home_dir == (char *)0x0) {
              main_cold_5();
              __s = (char **)0x1;
              bVar1 = false;
            }
          }
          pcVar11 = (char *)local_80;
          if (!bVar1) goto LAB_00103964;
        }
        else {
          free(home_dir);
          pcVar13 = getenv("HOME");
          home_dir = strdup(pcVar13);
          if (home_dir == (char *)0x0) {
            main_cold_4();
            goto LAB_0010395e;
          }
        }
      }
      else {
        change_root_dir(&home_dir);
      }
      pcVar13 = getenv("XDG_CONFIG_HOME");
      if (pcVar13 == (char *)0x0) {
LAB_00103410:
        iVar5 = asprintf(&xdg_config_dir,"%s/.config",home_dir);
        peVar7 = (econf_file *)local_78;
        if (iVar5 < 0) goto LAB_00103b53;
      }
      else {
        xdg_config_dir = strdup(pcVar13);
        if (xdg_config_dir == (char *)0x0) {
          main_cold_6();
          goto LAB_00103410;
        }
      }
      ppeVar17 = local_78;
      free(home_dir);
      change_root_dir(&root_dir);
      change_root_dir(&usr_root_dir);
      peVar7 = ppeVar17[_optind];
      iVar5 = strcmp((char *)peVar7,"show");
      if (iVar5 == 0) {
        pcVar13 = (char *)0x1;
LAB_00103583:
        uVar4 = econf_read((econf_file **)pcVar11,(char *)local_88,pcVar13,(_Bool)show);
LAB_00103588:
        __s = (char **)(ulong)uVar4;
        goto LAB_0010358b;
      }
      iVar5 = strcmp((char *)peVar7,"syntax");
      if (iVar5 == 0) {
        pcVar13 = (char *)0x0;
        goto LAB_00103583;
      }
      iVar5 = strcmp((char *)peVar7,"edit");
      ppeVar17 = local_88;
      if (iVar5 != 0) {
        iVar5 = strcmp((char *)peVar7,"revert");
        if (iVar5 == 0) {
          uVar4 = econf_revert(_Var2 == 0,(_Bool)((byte)local_94 & 1));
          goto LAB_00103588;
        }
        iVar5 = strcmp((char *)peVar7,"cat");
        if (iVar5 == 0) {
          key_file_edit = (econf_file *)0x0;
          if (*conf_filename == '/') {
            main_cold_8();
LAB_00103b21:
            __s = (char **)0xffffffff;
          }
          else {
            error = econf_readDirsHistory
                              (&key_files,&key_file_edit,usr_root_dir,root_dir,conf_basename,
                               conf_suffix,pcVar11,local_88);
            if (error != ECONF_SUCCESS) {
              print_error(error);
              goto LAB_00103b21;
            }
            pr_header();
            if (key_file_edit != (econf_file *)0x0) {
              peVar7 = (econf_file *)0x0;
              do {
                pr_key_file(key_files[(long)peVar7]);
                econf_freeFile(key_files[(long)peVar7]);
                peVar7 = peVar7 + 1;
              } while (peVar7 < key_file_edit);
            }
            free(key_files);
            __s = (char **)0x0;
          }
          goto LAB_0010358b;
        }
        goto LAB_00103b58;
      }
      if (_Var2 == 0 && (local_94 & 1) == 0) {
        if ((local_90 & 1) != 0) {
          free(conf_filename);
          pcVar13 = strdup("90_econftool.conf");
          conf_filename = pcVar13;
          if (pcVar13 == (char *)0x0) goto LAB_00103b88;
          free(conf_path);
          iVar5 = asprintf(&conf_path,"%s/%s",conf_dir,pcVar13);
          if (iVar5 < 0) {
            main_cold_9();
            goto LAB_0010395e;
          }
        }
      }
      else {
        free(conf_dir);
        conf_dir = strdup(xdg_config_dir);
        ppeVar17 = local_88;
        if (conf_dir == (char *)0x0) goto LAB_00103b5d;
        change_root_dir(&conf_dir);
        free(conf_path);
        iVar5 = asprintf(&conf_path,"%s/%s",conf_dir,conf_filename);
        if (iVar5 < 0) {
          main_cold_24();
          goto LAB_0010395e;
        }
      }
      key_file_edit = (econf_file *)0x0;
      if (*conf_filename == '/') {
        iVar5 = econf_readFile(&main::key_file,conf_filename,pcVar11,ppeVar17);
      }
      else {
        main::key_file = init_key_file();
        iVar5 = econf_readConfig(&main::key_file,0,0,conf_basename,conf_suffix,pcVar11,ppeVar17);
      }
      if (iVar5 != 0) {
        if (iVar5 == 3) {
          iVar5 = econf_newIniFile(&main::key_file);
          if (iVar5 == 0) goto LAB_00103752;
          main_cold_11();
        }
        else {
          main_cold_23();
        }
        goto LAB_00103b21;
      }
LAB_00103752:
      peVar9 = (econf_file *)getenv("TMPDIR");
      peVar7 = (econf_file *)"/tmp";
      if (peVar9 != (econf_file *)0x0) {
        peVar7 = peVar9;
      }
      key_files = (econf_file **)0x6f63652f706d742f;
      uStack_60 = 0x6c6f6f74666e;
      uStack_5a = 0x582d;
      uStack_58 = 0x5858585858;
      iVar5 = mkstemp((char *)&key_files);
      if (iVar5 == -1) {
        pcVar15 = "mkstemp() failed";
        pcVar13 = (char *)0x0;
LAB_00103a36:
        perror(pcVar15);
        bVar1 = false;
      }
      else {
        pcVar13 = strdup((char *)&key_files);
        bVar1 = true;
        if (pcVar13 == (char *)0x0) {
          pcVar15 = "out of memory!";
          goto LAB_00103a36;
        }
      }
      if (bVar1) {
        pcVar13 = strdup(pcVar13);
        if (pcVar13 != (char *)0x0) {
          pcVar15 = strrchr(pcVar13,0x2f);
          __s = (char **)strdup(pcVar15 + 1);
          if ((econf_file *)__s != (econf_file *)0x0) {
            getenv("EDITOR");
            _Var3 = fork();
            if (_Var3 == 0) goto LAB_00103b62;
            if (_Var3 == -1) goto LAB_00103b83;
            _Var3 = waitpid(_Var3,(int *)&groupsEdit,0);
            if ((_Var3 == -1) && (piVar10 = __errno_location(), *piVar10 != 4)) {
              perror("waitpid");
            }
            else if (((ulong)groupsEdit & 0x7f) == 0) {
              iVar5 = econf_readFile(&key_file_edit,pcVar13,pcVar11,ppeVar17);
              if (iVar5 == 0) {
                remove(pcVar13);
                key_files = (econf_file **)0x0;
                groupsEdit = (char **)0x0;
                groupCount = 0;
                groupEditCount = 0;
                iVar5 = econf_getGroups(main::key_file);
                if (iVar5 != 0) {
                  main_cold_17();
                  goto LAB_00103ad2;
                }
                iVar5 = econf_getGroups(key_file_edit,&groupEditCount,&groupsEdit);
                if (iVar5 != 0) {
                  main_cold_18();
                  goto LAB_00103ad2;
                }
                iVar5 = access(conf_dir,0);
                if (((iVar5 == -1) && (piVar10 = __errno_location(), *piVar10 == 2)) &&
                   (iVar5 = mkdir(conf_dir,0x1ed), iVar5 != 0)) {
                  perror("mkdir() failed");
                  goto LAB_00103ad2;
                }
                __s = (char **)0x0;
                iVar5 = access(conf_path,0);
                if ((iVar5 == 0) && (non_interactive == '\0')) {
                  local_8a = 0;
                  local_8c = 0;
                  goto LAB_001039b6;
                }
                printf("Writing file %s to %s\n",conf_filename,conf_dir);
                iVar5 = econf_writeFile(key_file_edit,conf_dir,conf_filename);
                if (iVar5 == 0) goto LAB_00103ad8;
                main_cold_21();
                goto LAB_00103ad2;
              }
              main_cold_16();
            }
            else {
              main_cold_15();
            }
            remove(pcVar13);
            goto LAB_00103b18;
          }
        }
        main_cold_22();
      }
LAB_00103b18:
      econf_freeFile(key_file_edit);
      goto LAB_00103b21;
    }
    if (iVar5 == 0x75) break;
    goto switchD_001030ce_caseD_65;
  }
  local_94 = (uint)CONCAT71((int7)((ulong)uVar6 >> 8),1);
  goto LAB_00103094;
LAB_001039b6:
  fprintf(_stdout,"The file %s/%s already exists!\n",conf_dir,conf_filename);
  fwrite("Do you really want to overwrite it?\nYes [y], no [n]\n",0x34,1,_stdout);
  iVar5 = __isoc99_scanf("%2s",&local_8c);
  if (iVar5 != 1) {
    main_cold_19();
  }
  if (local_8c == 0x79) {
    __s = (char **)0x0;
    printf("Writing file %s to %s\n",conf_filename,conf_dir);
    iVar5 = econf_writeFile(key_file_edit,conf_dir,conf_filename);
    if (iVar5 != 0) {
      main_cold_20();
LAB_00103ad2:
      __s = (char **)0xffffffff;
    }
    goto LAB_00103ad8;
  }
  if (local_8c == 0x6e) {
    __s = (char **)0x0;
LAB_00103ad8:
    econf_freeFile(key_file_edit);
    econf_freeArray(groupsEdit);
    econf_freeArray(key_files);
LAB_0010358b:
    econf_freeFile(main::key_file);
LAB_00103964:
    return (int)__s;
  }
  goto LAB_001039b6;
switchD_001030ce_caseD_65:
  main_cold_31();
LAB_00103b3f:
  main_cold_1();
LAB_00103b44:
  main_cold_29();
  peVar7 = (econf_file *)pcVar13;
LAB_00103b49:
  main_cold_3();
LAB_00103b4e:
  main_cold_28();
LAB_00103b53:
  main_cold_26();
LAB_00103b58:
  main_cold_7();
LAB_00103b5d:
  main_cold_25();
LAB_00103b62:
  uVar4 = econf_writeFile(main::key_file,peVar7,__s);
  if (uVar4 == 0) {
    main_cold_13();
LAB_00103b83:
    main_cold_14();
LAB_00103b88:
    main_cold_10();
    uVar4 = extraout_EAX;
  }
  pcVar15 = (char *)(ulong)uVar4;
  main_cold_12();
  pcVar11 = getenv("ECONFTOOL_ROOT");
  pcVar13 = pcVar11;
  if (pcVar11 != (char *)0x0) {
    pcVar14 = *(char **)pcVar15;
    if (pcVar14 != (char *)0x0) {
      sVar12 = strlen(pcVar11);
      uVar4 = strncmp(pcVar14,pcVar11,(long)(int)sVar12);
      pcVar13 = (char *)(ulong)uVar4;
      if (uVar4 == 0) goto LAB_00103c3a;
      if (pcVar14 != (char *)0x0) {
        pcVar13 = strdup(pcVar14);
        free(pcVar14);
        pcVar11 = getenv("ECONFTOOL_ROOT");
        pcVar14 = "%s%s";
        iVar5 = asprintf((char **)pcVar15,"%s%s",pcVar11,pcVar13);
        if (-1 < iVar5) {
          free(pcVar13);
          return extraout_EAX_00;
        }
        goto LAB_00103c45;
      }
    }
    pcVar14 = "%s";
    uVar4 = asprintf((char **)pcVar15,"%s",pcVar11);
    pcVar13 = (char *)(ulong)uVar4;
    if ((int)uVar4 < 0) {
      change_root_dir_cold_2();
LAB_00103c45:
      change_root_dir_cold_1();
      pcVar13 = strstr(pcVar15,pcVar14);
      if (pcVar13 != (char *)0x0) {
        sVar16 = (long)pcVar13 - (long)pcVar15;
        strncpy(replace_str::buffer,pcVar15,sVar16);
        replace_str::buffer[sVar16] = '\0';
        sVar12 = strlen(pcVar14);
        sprintf(replace_str::buffer + sVar16,"%s%s",extraout_RDX,pcVar13 + sVar12);
        pcVar15 = replace_str::buffer;
      }
      return (int)pcVar15;
    }
  }
LAB_00103c3a:
  return (int)pcVar13;
}

Assistant:

int main (int argc, char *argv[])
{
    static const char *dropin_filename = "90_econftool.conf";
    static econf_file *key_file = NULL;
    char *home_dir = NULL; /* the path of the home directory */
    bool is_dropin_file = true;
    bool is_root = false;
    bool use_homedir = false;
    char *comment = "#";
    char *delimiters = "=";

    /* parse command line arguments. See getopt_long(3) */
    int opt, nonopts;

    int index = 0;
    static struct option longopts[] = {
    /*   name,     arguments,      flag, value */
        {"full",        no_argument,       0, 'f'},
        {"help",        no_argument,       0, 'h'},
        {"yes",         no_argument,       0, 'y'},
        {"use-home",    no_argument,       0, 'u'},
	{"comment",     required_argument, 0, 'c'},
	{"delimiters",  required_argument, 0, 'd'},
        {0,             0,                 0,  0 }
    };

    root_dir = strdup("/etc");
    usr_root_dir = strdup("/usr/etc");
    conf_dir = strdup("");
    conf_basename = strdup("");

    while ((opt = getopt_long(argc, argv, "hfyuc:d:", longopts, &index)) != -1) {
        switch(opt) {
        case 'f':
            /* overwrite path */
	    free(conf_dir);
            if (asprintf(&conf_dir, "%s", "/etc") < 0) {
		fprintf(stderr, "Out of memory!\n");
		exit(EXIT_FAILURE);
	    }
            change_root_dir(&conf_dir);
            is_dropin_file = false;
            break;
        case 'h':
            usage();
            return EXIT_SUCCESS;
        case 'y':
            non_interactive = true;
            break;
        case 'u':
            use_homedir = true;
            break;
	case 'c':
	    comment = optarg;
	    break;
	case 'd':
	    delimiters = optarg;
	    break;
        case '?':
        default:
            fprintf(stderr, "Try '%s --help' for more information.\n", utilname);
            exit(EXIT_FAILURE);
            break;
        }
    }
    nonopts = argc - optind;

    /* only do something if we have an input */
    if (argc < 2) {
        usage();
        return EXIT_FAILURE;
    } else if (argc < 3 || nonopts < 2) {
        fprintf(stderr, "Invalid number of Arguments\n\n");
        usage();
        return EXIT_FAILURE;
    }

    /* translating delimiters */
    if ( strcmp(delimiters, "spaces") == 0 ) {
      delimiters = " \t\f\n\r\v";
    } else {
      delimiters = replace_str(delimiters, "\\t", "\t");
      delimiters = replace_str(delimiters, "\\f", "\f");
      delimiters = replace_str(delimiters, "\\n", "\n");
      delimiters = replace_str(delimiters, "\\r", "\r");
      delimiters = replace_str(delimiters, "\\v", "\v");
    }

    /**** initialization ****/
    /* basic write permission check */
    is_root = getuid() == 0;

    if ( argv[optind + 1][0] != '/') {
	/* it is not a single file only */

        /* get the position of the last dot in the filename to extract
         * the suffix from it.
         */
        conf_suffix = strrchr(argv[optind + 1], '.');
        if (conf_suffix == NULL) {
            fprintf(stderr, "Currently only works with a dot in the filename and a suffix!\n\n");
	    usage();
	    exit(1);
	} else {
            /* set filename to the proper argv argument */
            free(conf_basename);
	    conf_basename = strndup(argv[optind + 1], strlen(argv[optind + 1]) - strlen(conf_suffix));
	    if (conf_basename == NULL) {
	        fprintf(stderr, "Out of memory!\n");
		return EXIT_FAILURE;
	    }
	}
    }

    conf_filename = strdup(argv[optind + 1]);
    if (conf_filename == NULL) {
	fprintf(stderr, "Out of memory!\n");
	exit(EXIT_FAILURE);
    }

    if (is_dropin_file) {
        free(conf_dir);
        if (asprintf(&conf_dir, "/etc/%s.d", conf_filename) < 0) {
	    fprintf(stderr, "Out of memory!\n");
	    exit(EXIT_FAILURE);
        }
        change_root_dir(&conf_dir);
    }

    free(conf_path);
    if (asprintf(&conf_path, "%s/%s", conf_dir, conf_filename) < 0) {
	fprintf(stderr, "Out of memory!\n");
	return EXIT_FAILURE;
    }

    if (getenv("ECONFTOOL_ROOT") == NULL)
        if (getenv("HOME") != NULL) {
	    free(home_dir);
	    home_dir = strdup(getenv("HOME"));
	    if (home_dir == NULL) {
		fprintf(stderr, "Out of memory!\n");
		return EXIT_FAILURE;
	    }
        } else {
            struct passwd *pw = getpwuid(getuid());
            if(pw) {
		free (home_dir);
		home_dir = strdup(pw->pw_dir);
		if (home_dir == NULL) {
		    fprintf(stderr, "Out of memory!\n");
		    return EXIT_FAILURE;
		}
	    }
        }
    else
        change_root_dir(&home_dir);

    if (getenv("XDG_CONFIG_HOME") == NULL) {
        /* if no XDG_CONFIG_HOME is specified take ~/.config as default */
        if (asprintf(&xdg_config_dir, "%s/.config", home_dir) < 0) {
	    fprintf(stderr, "Out of memory!\n");
	    exit(EXIT_FAILURE);
        }
    } else {
        xdg_config_dir = strdup(getenv("XDG_CONFIG_HOME"));
	if (xdg_config_dir == NULL) {
	    fprintf(stderr, "Out of memory!\n");
	    exit(EXIT_FAILURE);
        }
    }

    free(home_dir);

    /* Change Root dirs */
    change_root_dir(&root_dir);
    change_root_dir(&usr_root_dir);

    int ret = 0;
    if (strcmp(argv[optind], "show") == 0) {
      ret = econf_read(&key_file, delimiters, comment, true);
    } else if (strcmp(argv[optind], "syntax") == 0) {
      ret = econf_read(&key_file, delimiters, comment, false);
    } else if (strcmp(argv[optind], "edit") == 0) {
        if (!is_root || use_homedir) {
            /* adjust path to home directory of the user.*/
            free(conf_dir);
	    conf_dir = strdup(xdg_config_dir);
	    if (conf_dir == NULL) {
	        fprintf(stderr, "Out of memory!\n");
		exit(EXIT_FAILURE);
	    }
            change_root_dir(&conf_dir);
	    free(conf_path);
	    if (asprintf(&conf_path, "%s/%s", conf_dir, conf_filename) < 0) {
		fprintf(stderr, "Out of memory!\n");
		return EXIT_FAILURE;
	    }
        } else if(is_dropin_file) {
	    free(conf_filename);
	    conf_filename = strdup(dropin_filename);
	    if (conf_filename == NULL) {
	        fprintf(stderr, "Out of memory!\n");
		exit(EXIT_FAILURE);
	    }
	    free(conf_path);
	    if (asprintf(&conf_path, "%s/%s", conf_dir, conf_filename) < 0) {
		fprintf(stderr, "Out of memory!\n");
		return EXIT_FAILURE;
	    }
	}

        ret = econf_edit(&key_file, delimiters, comment);
    } else if (strcmp(argv[optind], "revert") == 0) {
      ret = econf_revert(is_root, use_homedir);
    } else if (strcmp(argv[optind], "cat") == 0) {
	ret = econf_cat(delimiters, comment);
    } else {
        fprintf(stderr, "Unknown command!\n\n");
        usage();
        exit(EXIT_FAILURE);
    }

    /* cleanup */
    econf_free(key_file);
    return ret;
}